

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TCPSocket.h
# Opt level: O2

Ptr __thiscall hwnet::TCPSocket::SetUserData(TCPSocket *this,any *ud_)

{
  any *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  Ptr PVar1;
  
  std::mutex::lock((mutex *)&ud_[0x93].counter);
  any::operator=((any *)&ud_[0xa6].counter,in_RDX);
  std::__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<hwnet::TCPSocket,void>
            ((__shared_ptr<hwnet::TCPSocket,(__gnu_cxx::_Lock_policy)2> *)this,
             (__weak_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2> *)&ud_[1].counter);
  pthread_mutex_unlock((pthread_mutex_t *)&ud_[0x93].counter);
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       extraout_RDX._M_pi;
  PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (Ptr)PVar1.super___shared_ptr<hwnet::TCPSocket,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

TCPSocket::Ptr SetUserData(any ud_) {
		std::lock_guard<std::mutex> guard(this->mtx);
		this->ud = ud_;	
		return shared_from_this();	
	}